

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_base.cpp
# Opt level: O0

void __thiscall QDtlsBasePrivate::clearDtlsError(QDtlsBasePrivate *this)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x14) = 0;
  QString::clear((QString *)this);
  return;
}

Assistant:

void QDtlsBasePrivate::clearDtlsError()
{
    errorCode = QDtlsError::NoError;
    errorDescription.clear();
}